

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NVector_MultiFab.cpp
# Opt level: O0

Real N_VMinQuotient_MultiFab(N_Vector num,N_Vector denom)

{
  MultiFab **ppMVar1;
  N_Vector in_RSI;
  FabArray<amrex::FArrayBox> *in_RDI;
  FabArray<amrex::FArrayBox> *unaff_retaddr;
  Real min;
  int nghost;
  sunindextype ncomp;
  MultiFab *mf_denom;
  MultiFab *mf_num;
  value_type_conflict1 local_30;
  undefined4 local_28;
  int local_24;
  MultiFab *local_20;
  FabArrayBase *this;
  int nghost_00;
  
  ppMVar1 = amrex::sundials::getMFptr((N_Vector)in_RDI);
  this = (FabArrayBase *)*ppMVar1;
  ppMVar1 = amrex::sundials::getMFptr(in_RSI);
  nghost_00 = (int)((ulong)in_RSI >> 0x20);
  local_20 = *ppMVar1;
  local_24 = amrex::FabArrayBase::nComp(this);
  local_28 = 0;
  local_30 = amrex::ReduceMin<amrex::FArrayBox,amrex::FArrayBox,N_VMinQuotient_MultiFab::__0,void>
                       (unaff_retaddr,in_RDI,nghost_00,(anon_class_4_1_a856b79d *)this);
  amrex::ParallelDescriptor::ReduceRealMin<double>(&local_30);
  return local_30;
}

Assistant:

amrex::Real N_VMinQuotient_MultiFab(N_Vector num, N_Vector denom)
{
    using namespace amrex;

    amrex::MultiFab *mf_num = amrex::sundials::getMFptr(num);
    amrex::MultiFab *mf_denom = amrex::sundials::getMFptr(denom);
    sunindextype ncomp = mf_num->nComp();

    // ghost cells not included
    int nghost = 0;
    Real min = amrex::ReduceMin(*mf_num, *mf_denom, nghost,
                 [=] AMREX_GPU_HOST_DEVICE (Box const& bx, Array4<Real const> const& num_fab, Array4<Real const> const& denom_fab) -> Real
    {
         Real min_loc = std::numeric_limits<Real>::max();
         const auto lo = lbound(bx);
         const auto hi = ubound(bx);

         for (int c = 0; c < ncomp; ++c) {
            for (int k = lo.z; k <= hi.z; ++k) {
               for (int j = lo.y; j <= hi.y; ++j) {
                  for (int i = lo.x; i <= hi.x; ++i) {
                     if (denom_fab(i,j,k,c) != amrex::Real(0.0))
                     {
                        amrex::Real num = num_fab(i,j,k,c);
                        amrex::Real denom = denom_fab(i,j,k,c);
                        min_loc = SUNMIN(min_loc, num / denom);
                     }
                  }
               }
            }
         }
         return min_loc;
     });

    amrex::ParallelDescriptor::ReduceRealMin(min);

    return min;
}